

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

void insert_suite::insert_decreasing(void)

{
  pair<int,_int> pVar1;
  pair<int,_int> pVar2;
  initializer_list<vista::pair<int,_int>_> __l;
  initializer_list<vista::pair<int,_int>_> __l_00;
  initializer_list<vista::pair<int,_int>_> __l_01;
  initializer_list<vista::pair<int,_int>_> __l_02;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> expect_3;
  allocator_type local_89;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  pair<int,_int> local_48;
  pair<int,_int> local_40;
  pair<int,_int> local_38;
  vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_> local_28;
  
  local_40 = (pair<int,_int>)&local_48;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = (pair<int,_int>)&local_68;
  local_38 = (pair<int,_int>)&uStack_60;
  local_68 = 0x40000002c;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x40000002c;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_88,__l,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0xf7,"void insert_suite::insert_decreasing()",(pair<int,_int> *)local_48,
             (pair<int,_int> *)local_38,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38 != local_40) {
    pVar2 = (pair<int,_int>)((long)local_38 + 8);
    *(pair<int,_int> *)local_38 = (pair<int,_int>)0x300000021;
    local_38 = pVar2;
    pVar2 = (pair<int,_int>)((long)local_38 + -8);
    if (pVar2 != local_48 && local_48 != local_38) {
      do {
        if (((pair<int,_int> *)((long)pVar2 + -8))->first <= *(int *)pVar2) break;
        pVar1 = *(pair<int,_int> *)pVar2;
        *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + -8);
        *(pair<int,_int> *)((long)pVar2 + -8) = pVar1;
        pVar2 = (pair<int,_int>)((long)pVar2 + -8);
      } while (pVar2 != local_48);
    }
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x300000021;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x40000002c;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_88,__l_00,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0xfd,"void insert_suite::insert_decreasing()",(pair<int,_int> *)local_48,
             (pair<int,_int> *)local_38,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38 != local_40) {
    pVar2 = (pair<int,_int>)((long)local_38 + 8);
    *(pair<int,_int> *)local_38 = (pair<int,_int>)0x200000016;
    local_38 = pVar2;
    pVar2 = (pair<int,_int>)((long)local_38 + -8);
    if (pVar2 != local_48 && local_48 != local_38) {
      do {
        if (((pair<int,_int> *)((long)pVar2 + -8))->first <= *(int *)pVar2) break;
        pVar1 = *(pair<int,_int> *)pVar2;
        *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + -8);
        *(pair<int,_int> *)((long)pVar2 + -8) = pVar1;
        pVar2 = (pair<int,_int>)((long)pVar2 + -8);
      } while (pVar2 != local_48);
    }
  }
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x200000016;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<int,_int> *)0x300000021;
  local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x40000002c;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_28;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_88,__l_01,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x103,"void insert_suite::insert_decreasing()",(pair<int,_int> *)local_48,
             (pair<int,_int> *)local_38,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_88.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_88.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38 != local_40) {
    pVar2 = (pair<int,_int>)((long)local_38 + 8);
    *(pair<int,_int> *)local_38 = (pair<int,_int>)0x10000000b;
    local_38 = pVar2;
    pVar2 = (pair<int,_int>)((long)local_38 + -8);
    if (pVar2 != local_48 && local_48 != local_38) {
      do {
        if (((pair<int,_int> *)((long)pVar2 + -8))->first <= *(int *)pVar2) break;
        pVar1 = *(pair<int,_int> *)pVar2;
        *(pair<int,_int> *)pVar2 = *(pair<int,_int> *)((long)pVar2 + -8);
        *(pair<int,_int> *)((long)pVar2 + -8) = pVar1;
        pVar2 = (pair<int,_int>)((long)pVar2 + -8);
      } while (pVar2 != local_48);
    }
  }
  local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x300000021;
  uStack_70 = 0x40000002c;
  local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000b;
  local_88.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x200000016;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_88;
  std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>::vector
            (&local_28,__l_02,&local_89);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::pair<int,int>*,__gnu_cxx::__normal_iterator<vista::pair<int,int>*,std::vector<vista::pair<int,int>,std::allocator<vista::pair<int,int>>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x109,"void insert_suite::insert_decreasing()",(pair<int,_int> *)local_48,
             (pair<int,_int> *)local_38,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_28.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<vista::pair<int,_int>_*,_std::vector<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>_>
              )local_28.
               super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  if ((pair<int,_int>)
      local_28.super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int>)0x0) {
    operator_delete(local_28.
                    super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<vista::pair<int,_int>,_std::allocator<vista::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}